

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  ushort uVar8;
  int iVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  byte bVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  int i;
  long lVar17;
  ushort uVar18;
  int iVar19;
  ushort uVar20;
  int b;
  uint16_t top;
  ushort uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint16_t auVar24 [8];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  AES_state column;
  AES_state local_68;
  AES_state *local_50;
  undefined1 local_48 [16];
  
  if (-1 < nrounds) {
    memset(rounds,0,(ulong)(uint)nrounds * 0x10 + 0x10);
  }
  if (0 < nkeywords) {
    uVar7 = 0;
    do {
      iVar12 = 0;
      do {
        bVar13 = *key;
        lVar17 = 0;
        do {
          rounds->slice[(uVar7 & 0xfffffffffffffffc) * 2 + lVar17] =
               rounds->slice[(uVar7 & 0xfffffffffffffffc) * 2 + lVar17] |
               (ushort)(bVar13 & 1) << (((byte)uVar7 & 3) + (char)iVar12 * '\x04' & 0x1f);
          bVar13 = bVar13 >> 1;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 8);
        key = key + 1;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 4);
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 != nkeywords);
  }
  auVar23 = *(undefined1 (*) [16])rounds[nkeywords - 1U >> 2].slice;
  auVar1._10_2_ = 0;
  auVar1._0_10_ = auVar23._0_10_;
  auVar1._12_2_ = auVar23._6_2_;
  auVar2._8_2_ = auVar23._4_2_;
  auVar2._0_8_ = auVar23._0_8_;
  auVar2._10_4_ = auVar1._10_4_;
  auVar3._6_8_ = 0;
  auVar3._0_6_ = auVar2._8_6_;
  uVar7 = (ulong)(nkeywords - 1U & 3);
  auVar26._0_4_ = (int)(short)(auVar23._8_2_ >> uVar7);
  auVar26._4_4_ = (int)(short)(auVar23._10_2_ >> uVar7);
  auVar26._8_4_ = (int)(short)(auVar23._12_2_ >> uVar7);
  auVar26._12_4_ = (int)(short)(auVar23._14_2_ >> uVar7);
  auVar22._0_4_ = (int)(short)(auVar23._0_2_ >> uVar7);
  auVar22._4_4_ = (int)(short)((uint)CONCAT82(SUB148(auVar3 << 0x40,6),auVar23._2_2_) >> uVar7);
  auVar22._8_4_ = (int)(short)(auVar2._8_4_ >> uVar7);
  auVar22._12_4_ = (int)(short)((auVar1._10_4_ >> 0x10) >> uVar7);
  auVar23 = packssdw(auVar22,auVar26);
  auVar24 = (uint16_t  [8])(auVar23 & _DAT_006dc8e0);
  local_68.slice[0] = auVar24[0];
  local_68.slice[1] = auVar24[1];
  local_68.slice[2] = auVar24[2];
  local_68.slice[3] = auVar24[3];
  local_68.slice[4] = auVar24[4];
  local_68.slice[5] = auVar24[5];
  local_68.slice[6] = auVar24[6];
  local_68.slice[7] = auVar24[7];
  iVar12 = nrounds * 4 + 4;
  if (nkeywords < iVar12) {
    uVar5 = 1;
    local_48 = ZEXT416(1);
    uVar4 = 0;
    uVar6 = 0;
    uVar16 = 0;
    iVar19 = 0;
    local_50 = rounds;
    iVar9 = nkeywords;
    uVar21 = 0;
    uVar8 = 0;
    uVar20 = 0;
    uVar14 = 0;
    do {
      if (iVar19 == 0) {
        SubBytes(&local_68,0);
        auVar25._0_2_ = local_68.slice[0] >> 4;
        auVar25._2_2_ = local_68.slice[1] >> 4;
        auVar25._4_2_ = local_68.slice[2] >> 4;
        auVar25._6_2_ = local_68.slice[3] >> 4;
        auVar25._8_2_ = local_68.slice[4] >> 4;
        auVar25._10_2_ = local_68.slice[5] >> 4;
        auVar25._12_2_ = local_68.slice[6] >> 4;
        auVar25._14_2_ = local_68.slice[7] >> 4;
        auVar23 = psllw((undefined1  [16])local_68.slice,0xc);
        auVar24 = (uint16_t  [8])((auVar23 | auVar25) ^ local_48);
        local_68.slice[0] = auVar24[0];
        local_68.slice[1] = auVar24[1];
        local_68.slice[2] = auVar24[2];
        local_68.slice[3] = auVar24[3];
        local_68.slice[4] = auVar24[4];
        local_68.slice[5] = auVar24[5];
        local_68.slice[6] = auVar24[6];
        local_68.slice[7] = auVar24[7];
        local_48._8_2_ = uVar6 ^ uVar21;
        uVar6 = uVar4 ^ uVar21;
        local_48._2_2_ = uVar5 ^ uVar21;
        local_48._14_2_ = uVar16;
        local_48._12_2_ = uVar14;
        local_48._10_2_ = uVar20;
        local_48._6_2_ = uVar6;
        local_48._4_2_ = uVar8;
        local_48._0_2_ = uVar21;
        uVar18 = uVar16;
        uVar5 = uVar21;
        uVar11 = local_48._2_2_;
        uVar4 = uVar8;
        uVar10 = local_48._8_2_;
        uVar15 = uVar20;
        uVar16 = uVar14;
      }
      else {
        uVar18 = uVar21;
        uVar11 = uVar8;
        uVar10 = uVar20;
        uVar15 = uVar14;
        if (iVar19 == 4 && 6 < nkeywords) {
          SubBytes(&local_68,0);
        }
      }
      iVar19 = iVar19 + 1;
      lVar17 = 0;
      do {
        uVar21 = local_50[iVar9 - nkeywords >> 2].slice[lVar17] >> ((byte)(iVar9 - nkeywords) & 3) &
                 0x1111 ^ local_68.slice[lVar17];
        local_68.slice[lVar17] = uVar21;
        local_50[iVar9 >> 2].slice[lVar17] =
             local_50[iVar9 >> 2].slice[lVar17] | (ushort)((uVar21 & 0x1111) << ((byte)iVar9 & 3));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      if (iVar19 == nkeywords) {
        iVar19 = 0;
      }
      iVar9 = iVar9 + 1;
      uVar21 = uVar18;
      uVar8 = uVar11;
      uVar20 = uVar10;
      uVar14 = uVar15;
    } while (iVar9 != iVar12);
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}